

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O2

void __thiscall Temperature_Rankine_Test::~Temperature_Rankine_Test(Temperature_Rankine_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Temperature, Rankine)
{
    using namespace units;
    auto rankine = precise::temperature::rankine;

    EXPECT_FALSE(is_temperature(rankine));
    EXPECT_NEAR(convert(0.0, K, rankine), 0.0, test::tolerance);
    EXPECT_NEAR(
        convert(459.67, rankine, precise::degC), -17.7777777, test::tolerance);
    EXPECT_NEAR(convert(0.0, precise::degC, rankine), 491.67, test::tolerance);
    EXPECT_NEAR(convert(100, precise::degC, rankine), 671.67, test::tolerance);
    EXPECT_NEAR(convert(0, rankine, degF), -459.67, test::tolerance);
}